

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O0

void __thiscall
BtorSimVCDWriter::add_value_change(BtorSimVCDWriter *this,int64_t k,int64_t id,BtorSimState state)

{
  BtorSimArrayModel *pBVar1;
  bool bVar2;
  bool bVar3;
  int32_t iVar4;
  reference pvVar5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
  this_00;
  mapped_type *ppBVar6;
  int in_ECX;
  BtorSimState *in_RDX;
  EVP_PKEY_CTX *src;
  long in_RDI;
  BtorSimArrayModel *in_R8;
  int64_t in_stack_00000068;
  BtorSimVCDWriter *in_stack_00000070;
  string sval_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
  it;
  iterator __end3;
  iterator __begin3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
  *__range3;
  string sval;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
  *in_stack_fffffffffffffdb8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
  *in_stack_fffffffffffffdc0;
  BtorSimArrayModel *in_stack_fffffffffffffdc8;
  BtorSimState *in_stack_fffffffffffffdd0;
  BtorSimBitVector *in_stack_fffffffffffffe08;
  string local_1c8 [32];
  string local_1a8 [8];
  int64_t in_stack_fffffffffffffe60;
  BtorSimVCDWriter *in_stack_fffffffffffffe68;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
  local_120;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
  local_118;
  string local_110 [24];
  string *in_stack_ffffffffffffff08;
  mapped_type in_stack_ffffffffffffff10;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
  local_e0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
  *local_d8;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  _Self local_38;
  _Self local_30;
  BtorSimState *local_28;
  int local_10;
  BtorSimArrayModel *local_8;
  
  local_28 = in_RDX;
  local_10 = in_ECX;
  local_8 = in_R8;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
       ::find((map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
               *)in_stack_fffffffffffffdb8,(key_type *)0x12627f);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
       ::end((map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
              *)in_stack_fffffffffffffdb8);
  bVar2 = std::operator!=(&local_30,&local_38);
  if (!bVar2) {
    if (local_10 == 1) {
      if (local_8 == (BtorSimArrayModel *)0x0) {
        msg(1,"No current state for named state %ld!",local_28);
      }
      else {
        pvVar5 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                           ((vector<BtorSimState,_std::allocator<BtorSimState>_> *)(in_RDI + 0x2e0),
                            (size_type)local_28);
        pBVar1 = local_8;
        if ((pvVar5->field_1).bv_state != (BtorSimBitVector *)0x0) {
          pvVar5 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                             ((vector<BtorSimState,_std::allocator<BtorSimState>_> *)
                              (in_RDI + 0x2e0),(size_type)local_28);
          iVar4 = btorsim_bv_compare((BtorSimBitVector *)pBVar1,(pvVar5->field_1).bv_state);
          if (iVar4 == 0) {
            return;
          }
        }
        update_time(in_stack_00000070,in_stack_00000068);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,"",&local_59);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
        if (1 < (uint)local_8->index_width) {
          std::__cxx11::string::operator+=(local_58,"b");
        }
        btorsim_bv_to_string_abi_cxx11_(in_stack_fffffffffffffe08);
        std::__cxx11::string::operator+=(local_58,local_90);
        std::__cxx11::string::~string(local_90);
        if (1 < (uint)local_8->index_width) {
          std::__cxx11::string::operator+=(local_58," ");
        }
        get_bv_identifier_abi_cxx11_(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdc8,&in_stack_fffffffffffffdc0->first);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffdc0,&in_stack_fffffffffffffdb8->first);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_d0);
        std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                  ((vector<BtorSimState,_std::allocator<BtorSimState>_> *)(in_RDI + 0x2e0),
                   (size_type)local_28);
        btorsim_bv_copy((BtorSimBitVector *)in_stack_fffffffffffffdc0);
        BtorSimState::update
                  ((BtorSimState *)in_stack_fffffffffffffdc0,
                   (BtorSimBitVector *)in_stack_fffffffffffffdb8);
        std::__cxx11::string::~string(local_58);
      }
    }
    else if (local_10 == 2) {
      if (local_8 == (BtorSimArrayModel *)0x0) {
        msg(1,"No current state for named state %ld!",local_28);
      }
      else {
        pvVar5 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                           ((vector<BtorSimState,_std::allocator<BtorSimState>_> *)(in_RDI + 0x2e0),
                            (size_type)local_28);
        pBVar1 = local_8;
        if (((pvVar5->field_1).bv_state == (BtorSimBitVector *)0x0) ||
           (pvVar5 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                               ((vector<BtorSimState,_std::allocator<BtorSimState>_> *)
                                (in_RDI + 0x2e0),(size_type)local_28),
           pBVar1 != (BtorSimArrayModel *)(pvVar5->field_1).bv_state)) {
          update_time(in_stack_00000070,in_stack_00000068);
          local_d8 = &local_8->data;
          local_e0._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
               ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                        *)in_stack_fffffffffffffdb8);
          this_00._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                      *)in_stack_fffffffffffffdb8);
          while (bVar2 = std::__detail::operator!=
                                   (&local_e0,
                                    (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
                                     *)&stack0xffffffffffffff18), bVar2) {
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_false,_true>
            ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_false,_true>
                         *)0x1266c4);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
            ::pair(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
            pvVar5 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                               ((vector<BtorSimState,_std::allocator<BtorSimState>_> *)
                                (in_RDI + 0x2e0),(size_type)local_28);
            bVar2 = true;
            if ((pvVar5->field_1).bv_state != (BtorSimBitVector *)0x0) {
              std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                        ((vector<BtorSimState,_std::allocator<BtorSimState>_> *)(in_RDI + 0x2e0),
                         (size_type)local_28);
              local_118._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                   ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                           *)in_stack_fffffffffffffdb8,(key_type *)0x12672f);
              std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                        ((vector<BtorSimState,_std::allocator<BtorSimState>_> *)(in_RDI + 0x2e0),
                         (size_type)local_28);
              local_120._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                   ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                          *)in_stack_fffffffffffffdb8);
              bVar3 = std::__detail::operator==(&local_118,&local_120);
              bVar2 = true;
              if (!bVar3) {
                std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                          ((vector<BtorSimState,_std::allocator<BtorSimState>_> *)(in_RDI + 0x2e0),
                           (size_type)local_28);
                ppBVar6 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                          ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                                *)in_stack_fffffffffffffdc0,&in_stack_fffffffffffffdb8->first);
                bVar2 = *ppBVar6 != in_stack_ffffffffffffff10;
              }
            }
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_140,"",&local_141);
              std::allocator<char>::~allocator((allocator<char> *)&local_141);
              if (1 < in_stack_ffffffffffffff10->width) {
                std::__cxx11::string::operator+=(local_140,"b");
              }
              btorsim_bv_to_string_abi_cxx11_(in_stack_fffffffffffffe08);
              std::__cxx11::string::operator+=(local_140,local_168);
              std::__cxx11::string::~string(local_168);
              if (1 < in_stack_ffffffffffffff10->width) {
                std::__cxx11::string::operator+=(local_140," ");
              }
              in_stack_fffffffffffffdc8 = (BtorSimArrayModel *)(in_RDI + 0x278);
              in_stack_fffffffffffffdd0 = local_28;
              std::__cxx11::string::string(local_1c8,local_110);
              get_am_identifier((BtorSimVCDWriter *)this_00._M_cur,
                                (int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffdc8,&in_stack_fffffffffffffdc0->first);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffdc0,&in_stack_fffffffffffffdb8->first);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
              std::__cxx11::string::~string(local_1a8);
              std::__cxx11::string::~string(local_1c8);
              std::__cxx11::string::~string(local_140);
            }
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
                     *)0x126a6a);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_false,_true>
            ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_false,_true>
                          *)in_stack_fffffffffffffdc0);
          }
          std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                    ((vector<BtorSimState,_std::allocator<BtorSimState>_> *)(in_RDI + 0x2e0),
                     (size_type)local_28);
          BtorSimArrayModel::copy(local_8,(EVP_PKEY_CTX *)local_28,src);
          BtorSimState::update(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        }
      }
    }
    else {
      die("Invalid state");
    }
  }
  return;
}

Assistant:

void
BtorSimVCDWriter::add_value_change (int64_t k, int64_t id, BtorSimState state)
{
  if (clocks.find (id) != clocks.end ()) return;
  switch (state.type)
  {
    case BtorSimState::Type::BITVEC: {
      if (!state.bv_state)
      {
        msg (1, "No current state for named state %" PRId64 "!", id);
        return;
      }
      if (!prev_value[id].bv_state
          || btorsim_bv_compare (state.bv_state, prev_value[id].bv_state))
      {
        update_time (k);
        std::string sval ("");
        if (state.bv_state->width > 1) sval += "b";
        sval += btorsim_bv_to_string (state.bv_state);
        if (state.bv_state->width > 1) sval += " ";
        value_changes.push_back (sval + get_bv_identifier (id));
        prev_value[id].update (btorsim_bv_copy (state.bv_state));
      }
    }
    break;
    case BtorSimState::Type::ARRAY: {
      if (!state.array_state)
      {
        msg (1, "No current state for named state %" PRId64 "!", id);
        return;
      }

      if (!prev_value[id].array_state
          || state.array_state != prev_value[id].array_state)
      {
        update_time (k);
        for (auto it : state.array_state->data)
        {
          if (!prev_value[id].array_state
              || prev_value[id].array_state->data.find (it.first)
                     == prev_value[id].array_state->data.end ()
              || prev_value[id].array_state->data.at (it.first) != it.second)
          {
            std::string sval ("");
            if (it.second->width > 1) sval += "b";
            sval += btorsim_bv_to_string (it.second);
            if (it.second->width > 1) sval += " ";
            value_changes.push_back (sval + get_am_identifier (id, it.first));
          }
        }
        prev_value[id].update (state.array_state->copy ());
      }
    }
    break;
    default: die ("Invalid state");
  }
}